

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGroupCalculateMetricExportDataExp
          (ze_driver_handle_t hDriver,zet_metric_group_calculation_type_t type,size_t exportDataSize
          ,uint8_t *pExportData,zet_metric_calculate_exp_desc_t *pCalculateDescriptor,
          uint32_t *pSetCount,uint32_t *pTotalMetricValueCount,uint32_t *pMetricCounts,
          zet_typed_value_t *pMetricValues)

{
  zet_pfnMetricGroupCalculateMetricExportDataExp_t pfnCalculateMetricExportDataExp;
  ze_result_t result;
  uint32_t *pSetCount_local;
  zet_metric_calculate_exp_desc_t *pCalculateDescriptor_local;
  uint8_t *pExportData_local;
  size_t exportDataSize_local;
  zet_metric_group_calculation_type_t type_local;
  ze_driver_handle_t hDriver_local;
  
  pfnCalculateMetricExportDataExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c8b8 != (code *)0x0) {
    pfnCalculateMetricExportDataExp._4_4_ =
         (*DAT_0011c8b8)(hDriver,type,exportDataSize,pExportData,pCalculateDescriptor,pSetCount,
                         pTotalMetricValueCount,pMetricCounts,pMetricValues);
  }
  return pfnCalculateMetricExportDataExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCalculateMetricExportDataExp(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        zet_metric_group_calculation_type_t type,       ///< [in] calculation type to be applied on raw data
        size_t exportDataSize,                          ///< [in] size in bytes of exported data buffer
        const uint8_t* pExportData,                     ///< [in][range(0, exportDataSize)] buffer of exported data to calculate
        zet_metric_calculate_exp_desc_t* pCalculateDescriptor,  ///< [in] descriptor specifying calculation specific parameters
        uint32_t* pSetCount,                            ///< [in,out] pointer to number of metric sets.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of metric sets to be calculated.
                                                        ///< if count is greater than the number available in the raw data buffer,
                                                        ///< then the driver shall update the value with the actual number of
                                                        ///< metric sets to be calculated.
        uint32_t* pTotalMetricValueCount,               ///< [in,out] pointer to number of the total number of metric values
                                                        ///< calculated, for all metric sets.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of metric values to be calculated.
                                                        ///< if count is greater than the number available in the raw data buffer,
                                                        ///< then the driver shall update the value with the actual number of
                                                        ///< metric values to be calculated.
        uint32_t* pMetricCounts,                        ///< [in,out][optional][range(0, *pSetCount)] buffer of metric counts per
                                                        ///< metric set.
        zet_typed_value_t* pMetricValues                ///< [in,out][optional][range(0, *pTotalMetricValueCount)] buffer of
                                                        ///< calculated metrics.
                                                        ///< if count is less than the number available in the raw data buffer,
                                                        ///< then driver shall only calculate that number of metric values.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCalculateMetricExportDataExp = context.zetDdiTable.MetricGroupExp.pfnCalculateMetricExportDataExp;
        if( nullptr != pfnCalculateMetricExportDataExp )
        {
            result = pfnCalculateMetricExportDataExp( hDriver, type, exportDataSize, pExportData, pCalculateDescriptor, pSetCount, pTotalMetricValueCount, pMetricCounts, pMetricValues );
        }
        else
        {
            // generic implementation
        }

        return result;
    }